

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufGrow(xmlBufPtr buf,int len)

{
  xmlBufferAllocationScheme xVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *extra;
  ulong uVar8;
  long lVar9;
  
  iVar7 = -1;
  if (len < 0 || buf == (xmlBufPtr)0x0) {
    return -1;
  }
  if (len == 0) {
    return 0;
  }
  if (buf->error == 0) {
    uVar2 = (ulong)buf->compat_size;
    if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
      buf->size = uVar2;
    }
    uVar2 = (ulong)buf->compat_use;
    if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
      buf->use = uVar2;
    }
    xVar1 = buf->alloc;
    if (xVar1 != XML_BUFFER_ALLOC_IMMUTABLE) {
      uVar6 = (ulong)(uint)len;
      uVar2 = buf->use;
      uVar4 = buf->size;
      if (uVar6 < uVar4 - uVar2) {
        uVar8 = (uVar4 - uVar2) - 1;
        goto LAB_00136511;
      }
      if (uVar6 < ~uVar2) {
        if (uVar6 < uVar4) {
          uVar8 = 0xffffffffffffffff;
          if (-1 < (long)uVar4) {
            uVar8 = uVar4 * 2;
          }
        }
        else {
          uVar8 = 0xffffffffffffffff;
          if (uVar2 + uVar6 < 0xffffffffffffff9c) {
            uVar8 = uVar2 + uVar6 + 100;
          }
        }
        if (xVar1 == XML_BUFFER_ALLOC_BOUNDED) {
          if ((9999999 < uVar4) || ((uVar6 + uVar2) - 9999999 < 0xffffffffff676980)) {
            xmlBufMemoryError(buf,"buffer error: text too long\n");
            goto LAB_0013650e;
          }
          if (9999999 < uVar8) {
            uVar8 = 10000000;
          }
        }
        if ((xVar1 == XML_BUFFER_ALLOC_IO) && (pxVar3 = buf->contentIO, pxVar3 != (xmlChar *)0x0)) {
          lVar9 = (long)buf->content - (long)pxVar3;
          pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar3,uVar8 + lVar9);
          if (pxVar3 == (xmlChar *)0x0) {
            __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"growing buffer");
            if (buf->error == 0) {
              buf->error = 2;
            }
          }
          else {
            buf->contentIO = pxVar3;
            buf->content = pxVar3 + lVar9;
          }
          if (pxVar3 == (xmlChar *)0x0) goto LAB_0013650e;
        }
        else {
          pxVar3 = (xmlChar *)(*xmlRealloc)(buf->content,uVar8);
          if (pxVar3 == (xmlChar *)0x0) {
            extra = "growing buffer";
            goto LAB_00136579;
          }
          buf->content = pxVar3;
        }
        buf->size = uVar8;
        uVar5 = 0x7fffffff;
        if (uVar8 < 0x7fffffff) {
          uVar5 = (uint)uVar8;
        }
        buf->compat_size = uVar5;
        uVar2 = buf->use;
        uVar4 = 0x7fffffff;
        if (uVar2 < 0x7fffffff) {
          uVar4 = uVar2;
        }
        buf->compat_use = (uint)uVar4;
        uVar8 = ~uVar2 + uVar8;
        goto LAB_00136511;
      }
      extra = "growing buffer past SIZE_MAX";
LAB_00136579:
      uVar8 = 0;
      __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,extra);
      if (buf->error != 0) goto LAB_00136511;
      buf->error = 2;
    }
  }
LAB_0013650e:
  uVar8 = 0;
LAB_00136511:
  if (buf->error == 0) {
    uVar2 = 0x7fffffff;
    if (uVar8 < 0x7fffffff) {
      uVar2 = uVar8;
    }
    iVar7 = (int)uVar2;
  }
  return iVar7;
}

Assistant:

int
xmlBufGrow(xmlBufPtr buf, int len) {
    size_t ret;

    if ((buf == NULL) || (len < 0)) return(-1);
    if (len == 0)
        return(0);
    ret = xmlBufGrowInternal(buf, len);
    if (buf->error != 0)
        return(-1);
    return(ret > INT_MAX ? INT_MAX : ret);
}